

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

bool __thiscall
ThreadedReplayer::enqueue_create_graphics_pipeline
          (ThreadedReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  VkGraphicsPipelineCreateInfo *pVVar4;
  PerThreadData *pPVar5;
  size_type sVar6;
  reference pvVar7;
  mapped_type *pmVar8;
  atomic<unsigned_int> *paVar9;
  mapped_type *p;
  lock_guard<std::mutex> holder;
  bool force_outside_range;
  uint memory_index;
  uint index;
  PerThreadData *per_thread;
  bool generates_library;
  VkGraphicsPipelineCreateInfo *info;
  VkPipeline *pipeline_local;
  VkGraphicsPipelineCreateInfo *create_info_local;
  Hash hash_local;
  ThreadedReplayer *this_local;
  
  create_info->flags = create_info->flags & 0xfffffff9;
  create_info->basePipelineHandle = (VkPipeline)0x0;
  create_info->basePipelineIndex = -1;
  if (((this->opts).pipeline_stats & 1U) != 0) {
    create_info->flags = create_info->flags | 0x40;
  }
  uVar1 = create_info->flags;
  create_info_local = (VkGraphicsPipelineCreateInfo *)hash;
  hash_local = (Hash)this;
  pPVar5 = get_per_thread_data(this);
  uVar2 = pPVar5->current_parse_index;
  uVar3 = pPVar5->memory_context_index;
  if (((VkGraphicsPipelineCreateInfo *)pPVar5->expected_hash == create_info_local) &&
     (pPVar5->expected_tag == RESOURCE_GRAPHICS_PIPELINE)) {
    pPVar5->acknowledge_parsing_work = true;
    if ((pPVar5->force_outside_range & 1U) == 0) {
      sVar6 = std::
              vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
              ::size(this->deferred_graphics + uVar3);
      pVVar4 = create_info_local;
      if (sVar6 <= uVar2) {
        __assert_fail("index < deferred_graphics[memory_index].size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_replay.cpp"
                      ,0x888,
                      "virtual bool ThreadedReplayer::enqueue_create_graphics_pipeline(Hash, const VkGraphicsPipelineCreateInfo *, VkPipeline *)"
                     );
      }
      holder._M_device = (mutex_type *)create_info;
      pvVar7 = std::
               vector<ThreadedReplayer::DeferredGraphicsInfo,_std::allocator<ThreadedReplayer::DeferredGraphicsInfo>_>
               ::operator[](this->deferred_graphics + uVar3,(ulong)uVar2);
      pvVar7->info = (VkGraphicsPipelineCreateInfo *)holder._M_device;
      pvVar7->hash = (Hash)pVVar4;
      pvVar7->pipeline = pipeline;
      pvVar7->index = uVar2;
    }
    else {
      std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&p,&this->hash_lock);
      if ((uVar1 & 0x800) != 0) {
        pmVar8 = std::
                 unordered_map<unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredGraphicsInfo>_>_>
                 ::operator[](&this->graphics_parents,(key_type *)&create_info_local);
        pmVar8->info = create_info;
        pmVar8->hash = (Hash)create_info_local;
        pmVar8->pipeline = pipeline;
        pmVar8->index = uVar2;
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&p);
    }
    *pipeline = (VkPipeline)create_info_local;
    if ((this->opts).control_block != (SharedControlBlock *)0x0) {
      paVar9 = &((this->opts).control_block)->parsed_graphics;
      LOCK();
      (paVar9->super___atomic_base<unsigned_int>)._M_i =
           (paVar9->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
    }
    this_local._7_1_ = true;
  }
  else {
    fprintf(_stderr,"Fossilize ERROR: Unexpected resource type or hash in blob, ignoring.\n");
    fflush(_stderr);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool enqueue_create_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		// Ignore derived pipelines, no relevant drivers use them.
		auto *info = const_cast<VkGraphicsPipelineCreateInfo *>(create_info);
		info->flags &= ~(VK_PIPELINE_CREATE_DERIVATIVE_BIT | VK_PIPELINE_CREATE_ALLOW_DERIVATIVES_BIT);
		info->basePipelineHandle = VK_NULL_HANDLE;
		info->basePipelineIndex = -1;

		if (opts.pipeline_stats)
			info->flags |= VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR;

		bool generates_library = (create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0;

		auto &per_thread = get_per_thread_data();
		unsigned index = per_thread.current_parse_index;
		unsigned memory_index = per_thread.memory_context_index;
		bool force_outside_range = per_thread.force_outside_range;

		if (per_thread.expected_hash != hash || per_thread.expected_tag != RESOURCE_GRAPHICS_PIPELINE)
		{
			LOGE("Unexpected resource type or hash in blob, ignoring.\n");
			return false;
		}

		per_thread.acknowledge_parsing_work = true;

		if (!force_outside_range)
		{
			assert(index < deferred_graphics[memory_index].size());
			deferred_graphics[memory_index][index] = {
				const_cast<VkGraphicsPipelineCreateInfo *>(create_info), hash, pipeline, index,
			};
		}
		else
		{
			lock_guard<mutex> holder(hash_lock);
			if (generates_library)
			{
				auto &p = graphics_parents[hash];
				p = { const_cast<VkGraphicsPipelineCreateInfo *>(create_info), hash, pipeline, index };
			}
		}

		*pipeline = (VkPipeline)hash;
		if (opts.control_block)
			opts.control_block->parsed_graphics.fetch_add(1, std::memory_order_relaxed);

		return true;
	}